

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeAddrMode6Operand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t RegNo;
  uint32_t uVar2;
  DecodeStatus In;
  uint align;
  uint Rm;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  MCInst *pMStack_18;
  uint Val_local;
  MCInst *Inst_local;
  
  align = 3;
  _Rm = Decoder;
  Decoder_local = (void *)Address;
  Address_local._4_4_ = Val;
  pMStack_18 = Inst;
  RegNo = fieldFromInstruction_4(Val,0,4);
  uVar2 = fieldFromInstruction_4(Address_local._4_4_,4,2);
  In = DecodeGPRRegisterClass(pMStack_18,RegNo,(uint64_t)Decoder_local,_Rm);
  _Var1 = Check(&align,In);
  if (_Var1) {
    if (uVar2 == 0) {
      MCOperand_CreateImm0(pMStack_18,0);
    }
    else {
      MCOperand_CreateImm0(pMStack_18,(long)(4 << ((byte)uVar2 & 0x1f)));
    }
    Inst_local._4_4_ = align;
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeAddrMode6Operand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rm = fieldFromInstruction_4(Val, 0, 4);
	unsigned align = fieldFromInstruction_4(Val, 4, 2);

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!align)
		MCOperand_CreateImm0(Inst, 0);
	else
		MCOperand_CreateImm0(Inst, 4 << align);

	return S;
}